

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_vine_swap.h
# Opt level: O3

bool __thiscall
Gudhi::persistence_matrix::
RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
::_positive_vine_swap
          (RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
           *this,Index columnIndex)

{
  key_type kVar1;
  Pos_index targetIndex;
  Pos_index sourceIndex;
  undefined8 in_RAX;
  iterator iVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  pointer p;
  key_type *pkVar5;
  long *plVar6;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  targetIndex = _get_death(this,columnIndex);
  sourceIndex = _get_death(this,columnIndex + 1);
  if (targetIndex == 0xffffffff) {
    _swap_at_index(this,columnIndex);
    if (sourceIndex != 0xffffffff) {
      uStack_38 = CONCAT44(columnIndex + 1,(undefined4)uStack_38);
      iVar2 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)this,(key_type *)((long)&uStack_38 + 4));
      pkVar5 = (key_type *)
               ((long)iVar2.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur + 0xc);
      if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
          == (__node_type *)0x0) {
        pkVar5 = (key_type *)((long)&uStack_38 + 4);
      }
      kVar1 = *pkVar5;
      uStack_38 = CONCAT44(sourceIndex,(undefined4)uStack_38);
      cVar3 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(this + 4),(key_type *)((long)&uStack_38 + 4));
      if (cVar3.
          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        uStack_38 = CONCAT44(kVar1,(undefined4)uStack_38);
        cVar4 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)&this[1].super_type.map_._M_h._M_single_bucket,
                       (key_type *)((long)&uStack_38 + 4));
        if (cVar4.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur != (__node_type *)0x0) {
          plVar6 = (long *)((long)cVar3.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_false>
                                  ._M_cur + 0x28);
          while (plVar6 = (long *)*plVar6,
                plVar6 != (long *)((long)cVar3.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_false>
                                         ._M_cur + 0x28)) {
            if (plVar6 == (long *)0x0) goto LAB_001539ad;
            if (*(int *)(plVar6 + 2) ==
                *(int *)((long)cVar4.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                               ._M_cur + 0xc)) {
              return false;
            }
          }
          goto LAB_00153981;
        }
      }
      goto LAB_001539cc;
    }
  }
  else {
    if (sourceIndex != 0xffffffff) {
      uStack_38 = CONCAT44(columnIndex,(undefined4)uStack_38);
      iVar2 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)this,(key_type *)((long)&uStack_38 + 4));
      pkVar5 = (key_type *)
               ((long)iVar2.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur + 0xc);
      if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
          == (__node_type *)0x0) {
        pkVar5 = (key_type *)((long)&uStack_38 + 4);
      }
      kVar1 = *pkVar5;
      uStack_38 = CONCAT44(sourceIndex,(undefined4)uStack_38);
      cVar3 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(this + 4),(key_type *)((long)&uStack_38 + 4));
      if (cVar3.
          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        uStack_38 = CONCAT44(kVar1,(undefined4)uStack_38);
        cVar4 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)&this[1].super_type.map_._M_h._M_single_bucket,
                       (key_type *)((long)&uStack_38 + 4));
        if (cVar4.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur != (__node_type *)0x0) {
          plVar6 = (long *)((long)cVar3.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_false>
                                  ._M_cur + 0x28);
          do {
            plVar6 = (long *)*plVar6;
            if (plVar6 == (long *)((long)cVar3.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_false>
                                         ._M_cur + 0x28)) goto LAB_001538ee;
            if (plVar6 == (long *)0x0) {
LAB_001539ad:
              __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                            "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true, false, false>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true, false, false>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true, false, false>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true, false, false>>::Matrix_column_tag, Type = 1]"
                           );
            }
          } while (*(int *)(plVar6 + 2) !=
                   *(int *)((long)cVar4.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ._M_cur + 0xc));
          _swap_at_index(this,columnIndex);
          if (sourceIndex <= targetIndex) {
            _add_to(this,sourceIndex,targetIndex);
            return false;
          }
          _add_to(this,targetIndex,sourceIndex);
          goto LAB_00153981;
        }
      }
LAB_001539cc:
      std::__throw_out_of_range("_Map_base::at");
    }
LAB_001538ee:
    _swap_at_index(this,columnIndex);
  }
LAB_00153981:
  _positive_transpose(this,columnIndex);
  return true;
}

Assistant:

inline bool RU_vine_swap<Master_matrix>::_positive_vine_swap(Index columnIndex) 
{
  const Pos_index iDeath = _get_death(columnIndex);
  const Pos_index iiDeath = _get_death(columnIndex + 1);

  if (iDeath != Master_matrix::template get_null_value<Pos_index>() &&
      iiDeath != Master_matrix::template get_null_value<Pos_index>() &&
      !(_matrix()->reducedMatrixR_.is_zero_entry(iiDeath, _get_row_id_from_position(columnIndex)))) {
    if (iDeath < iiDeath) {
      _swap_at_index(columnIndex);
      _add_to(iDeath, iiDeath);
      _positive_transpose(columnIndex);
      return true;
    }

    _swap_at_index(columnIndex);
    _add_to(iiDeath, iDeath);
    return false;
  }

  _swap_at_index(columnIndex);

  if (iDeath != Master_matrix::template get_null_value<Pos_index>() ||
      iiDeath == Master_matrix::template get_null_value<Pos_index>() ||
      _matrix()->reducedMatrixR_.is_zero_entry(iiDeath, _get_row_id_from_position(columnIndex + 1))) {
    _positive_transpose(columnIndex);
    return true;
  }
  return false;
}